

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O1

uintmax_t anon_unknown.dwarf_59c2::remove_all_aux(path *p,file_type type,error_code *ec)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  uintmax_t uVar4;
  uintmax_t unaff_RBP;
  uintmax_t uVar5;
  directory_iterator itr;
  directory_iterator local_50;
  path *local_40;
  file_type local_38 [2];
  
  uVar5 = 1;
  if (type == directory_file) {
    local_40 = p;
    boost::filesystem::directory_iterator::directory_iterator(&local_50,p);
    uVar5 = 1;
    while (peVar3 = local_50.m_imp.px, peVar2 = (anonymous_namespace)::end_dir_itr,
          local_50.m_imp.px != (anonymous_namespace)::end_dir_itr) {
      if (local_50.m_imp.px == (element_type *)0x0) {
LAB_0010d510:
        __assert_fail("(m_imp.get())&&(\"attempt to dereference end iterator\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/filesystem/operations.hpp"
                      ,0x3a7,
                      "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                     );
      }
      boost::filesystem::detail::symlink_status((detail *)local_38,(path *)local_50.m_imp.px,ec);
      if ((ec == (error_code *)0x0) || (ec->m_val == 0)) {
        if (local_50.m_imp.px == (element_type *)0x0) goto LAB_0010d510;
        uVar4 = remove_all_aux((path *)local_50.m_imp.px,local_38[0],ec);
        uVar5 = uVar5 + uVar4;
        bVar1 = true;
      }
      else {
        bVar1 = false;
        unaff_RBP = uVar5;
      }
      if (!bVar1) break;
      boost::filesystem::detail::directory_iterator_increment(&local_50,(error_code *)0x0);
    }
    boost::detail::shared_count::~shared_count(&local_50.m_imp.pn);
    p = local_40;
    if (peVar3 != peVar2) {
      return unaff_RBP;
    }
  }
  remove_file_or_directory(p,type,ec);
  return uVar5;
}

Assistant:

boost::uintmax_t remove_all_aux(const path& p, fs::file_type type,
    error_code* ec)
  {
    boost::uintmax_t count = 1;

    if (type == fs::directory_file)  // but not a directory symlink
    {
      for (fs::directory_iterator itr(p);
            itr != end_dir_itr; ++itr)
      {
        fs::file_type tmp_type = query_file_type(itr->path(), ec);
        if (ec != 0 && *ec)
          return count;
        count += remove_all_aux(itr->path(), tmp_type, ec);
      }
    }
    remove_file_or_directory(p, type, ec);
    return count;
  }